

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList
               (ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  ImGuiWindow *pIVar1;
  ImDrawVert *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  ImGuiWindow *window_1;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  uint *puVar12;
  ImDrawCmd *pIVar13;
  ImVec4 *buf_00;
  int iVar14;
  ImGuiContext *g;
  ImDrawList *draw_list_00;
  undefined4 uVar15;
  float fVar16;
  ImGuiListClipper clipper;
  ImVec2 triangle_1 [3];
  char buf [300];
  ImGuiListClipper local_1d8;
  ImDrawCmd *local_1c0;
  uint local_1b4;
  ImDrawList *local_1b0;
  ImDrawList *local_1a8;
  ImGuiContext *local_1a0;
  ulong local_198;
  ImVec2 local_190;
  ImVec2 local_188 [4];
  ImVec4 local_168 [18];
  undefined1 local_3c [12];
  
  pcVar8 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar8 = draw_list->_OwnerName;
  }
  uVar9 = (ulong)(uint)(draw_list->IdxBuffer).Size;
  bVar4 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds","DrawList",pcVar8,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,uVar9,(draw_list->CmdBuffer).Size);
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->DrawList == draw_list) {
    if (pIVar1->SkipItems == false) {
      (pIVar1->DC).CursorPos.x = (pIVar3->Style).ItemSpacing.x + (pIVar1->DC).CursorPosPrevLine.x;
      (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
      (pIVar1->DC).CurrLineSize = (pIVar1->DC).PrevLineSize;
      (pIVar1->DC).CurrLineTextBaseOffset = (pIVar1->DC).PrevLineTextBaseOffset;
    }
    local_168[0].x = 1.0;
    local_168[0].y = 0.4;
    local_168[0].z = 0.4;
    local_168[0].w = 1.0;
    TextColored(local_168,"CURRENTLY APPENDING");
    if (!bVar4) {
      return;
    }
  }
  else {
    local_1b0 = &pIVar3->ForegroundDrawList;
    if (window == (ImGuiWindow *)0x0) {
      if (!bVar4) {
        return;
      }
    }
    else {
      bVar5 = IsItemHovered(0);
      if (bVar5) {
        local_168[0].y = (window->Size).y + (window->Pos).y;
        local_168[0].x = (window->Size).x + (window->Pos).x;
        ImDrawList::AddRect(local_1b0,&window->Pos,(ImVec2 *)local_168,0xff00ffff,0.0,0xf,1.0);
      }
      if (!bVar4) {
        return;
      }
      if (window->WasActive == false) {
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
      }
    }
    if (0 < (draw_list->CmdBuffer).Size) {
      draw_list_00 = (ImDrawList *)(draw_list->CmdBuffer).Data;
      pIVar13 = (ImDrawCmd *)0x0;
      local_1a0 = pIVar3;
      do {
        pIVar2 = (draw_list_00->VtxBuffer).Data;
        if (pIVar2 == (ImDrawVert *)0x0) {
          uVar6 = (draw_list_00->CmdBuffer).Size;
          if (uVar6 != 0) {
            if ((draw_list->IdxBuffer).Size < 1) {
              puVar12 = (uint *)0x0;
            }
            else {
              puVar12 = (draw_list->IdxBuffer).Data;
            }
            local_1c0 = pIVar13;
            ImFormatString((char *)local_168,300,
                           "DrawCmd: %4d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                           SUB84((double)(float)(draw_list_00->CmdBuffer).Capacity,0),
                           SUB84((double)*(float *)&(draw_list_00->CmdBuffer).Data,0),
                           (double)*(float *)((long)&(draw_list_00->CmdBuffer).Data + 4),
                           (double)(float)(draw_list_00->IdxBuffer).Size,(ulong)uVar6 / 3,
                           (draw_list_00->IdxBuffer).Data);
            bVar4 = TreeNode((void *)(((long)draw_list_00 - (long)(draw_list->CmdBuffer).Data >> 3)
                                     * 0x6db6db6db6db6db7),"%s",local_168);
            bVar5 = IsItemHovered(0);
            if ((bVar5) && (((show_drawcmd_mesh | show_drawcmd_aabb) & 1U) != 0)) {
              NodeDrawCmdShowMeshAndBoundingBox
                        ((ImGuiWindow *)draw_list,draw_list_00,local_1c0,(uint)show_drawcmd_mesh,
                         (bool)((~show_drawcmd_mesh | show_drawcmd_aabb) & 1),SUB81(uVar9,0));
            }
            pIVar13 = local_1c0;
            if (bVar4) {
              uVar6 = (draw_list_00->CmdBuffer).Size + (uint)local_1c0;
              uVar15 = 0;
              if ((uint)local_1c0 < uVar6) {
                iVar14 = (draw_list->VtxBuffer).Size;
                uVar9 = (ulong)local_1c0 & 0xffffffff;
                fVar16 = 0.0;
                do {
                  local_1d8.DisplayStart = 0;
                  local_1d8.DisplayEnd = 0;
                  local_1d8.ItemsCount = 0;
                  local_1d8.StepNo = 0;
                  local_1d8.ItemsHeight = 0.0;
                  local_1d8.StartPosY = 0.0;
                  lVar10 = 0;
                  do {
                    uVar11 = (uint)(uVar9 + lVar10);
                    if (puVar12 != (uint *)0x0) {
                      uVar11 = puVar12[uVar9 + lVar10 & 0xffffffff];
                    }
                    if (iVar14 <= (int)uVar11) {
LAB_00162182:
                      __assert_fail("i < Size",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                                    ,0x52e,
                                    "T &ImVector<ImDrawVert>::operator[](int) [T = ImDrawVert]");
                    }
                    *(ImVec2 *)(&local_1d8.DisplayStart + lVar10 * 2) =
                         (draw_list->VtxBuffer).Data[(int)uVar11].pos;
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 3);
                  fVar16 = fVar16 + ABS(((float)local_1d8.DisplayEnd - (float)local_1d8.StepNo) *
                                        local_1d8.ItemsHeight +
                                        ((float)local_1d8.StepNo - local_1d8.StartPosY) *
                                        (float)local_1d8.DisplayStart +
                                        (local_1d8.StartPosY - (float)local_1d8.DisplayEnd) *
                                        (float)local_1d8.ItemsCount) * 0.5;
                  uVar9 = uVar9 + 3;
                } while ((uint)uVar9 < uVar6);
                uVar15 = SUB84((double)fVar16,0);
              }
              uVar9 = (ulong)(uint)(draw_list_00->VtxBuffer).Capacity;
              ImFormatString((char *)local_168,300,
                             "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                             uVar15);
              local_1d8.DisplayStart = 0;
              local_1d8.DisplayEnd = 0;
              Selectable((char *)local_168,false,0,(ImVec2 *)&local_1d8);
              bVar4 = IsItemHovered(0);
              if (bVar4) {
                NodeDrawCmdShowMeshAndBoundingBox
                          ((ImGuiWindow *)draw_list,draw_list_00,
                           (ImDrawCmd *)((ulong)pIVar13 & 0xffffffff),1,false,SUB81(uVar9,0));
              }
              local_1d8.StartPosY = (GImGui->CurrentWindow->DC).CursorPos.y;
              local_1d8.ItemsCount = (uint)(draw_list_00->CmdBuffer).Size / 3;
              local_1d8.StepNo = 0;
              local_1d8.ItemsHeight = -1.0;
              local_1d8.DisplayStart = -1;
              local_1d8.DisplayEnd = -1;
              local_1a8 = draw_list_00;
              while (bVar4 = ImGuiListClipper::Step(&local_1d8), bVar4) {
                local_1b4 = local_1d8.DisplayEnd;
                if (local_1d8.DisplayStart < local_1d8.DisplayEnd) {
                  iVar14 = local_1d8.DisplayStart * 3 + (int)local_1c0;
                  uVar6 = local_1d8.DisplayStart;
                  do {
                    local_198 = (ulong)uVar6;
                    local_188[0].x = 0.0;
                    local_188[0].y = 0.0;
                    local_188[1].x = 0.0;
                    local_188[1].y = 0.0;
                    local_188[2].x = 0.0;
                    local_188[2].y = 0.0;
                    lVar10 = 0;
                    buf_00 = local_168;
                    do {
                      uVar6 = iVar14 + (int)lVar10;
                      if (puVar12 != (uint *)0x0) {
                        uVar6 = puVar12[iVar14 + lVar10];
                      }
                      if ((draw_list->VtxBuffer).Size <= (int)uVar6) goto LAB_00162182;
                      pIVar2 = (draw_list->VtxBuffer).Data;
                      local_188[lVar10] = pIVar2[(int)uVar6].pos;
                      pcVar8 = "     ";
                      if (lVar10 == 0) {
                        pcVar8 = "Vert:";
                      }
                      uVar9 = (ulong)pIVar2[(int)uVar6].col;
                      iVar7 = ImFormatString((char *)buf_00,(size_t)(local_3c + -(long)buf_00),
                                             "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n"
                                             ,SUB84((double)pIVar2[(int)uVar6].pos.x,0),
                                             SUB84((double)pIVar2[(int)uVar6].pos.y,0),
                                             (double)pIVar2[(int)uVar6].uv.x,
                                             (double)pIVar2[(int)uVar6].uv.y,pcVar8);
                      buf_00 = (ImVec4 *)((long)&buf_00->x + (long)iVar7);
                      lVar10 = lVar10 + 1;
                    } while (lVar10 != 3);
                    local_190.x = 0.0;
                    local_190.y = 0.0;
                    Selectable((char *)local_168,false,0,&local_190);
                    bVar4 = IsItemHovered(0);
                    pIVar3 = local_1a0;
                    if (bVar4) {
                      uVar6 = (local_1a0->ForegroundDrawList).Flags;
                      (local_1a0->ForegroundDrawList).Flags = uVar6 & 0xfffffffe;
                      ImDrawList::AddPolyline(local_1b0,local_188,3,0xff00ffff,true,1.0);
                      (pIVar3->ForegroundDrawList).Flags = uVar6;
                    }
                    iVar14 = iVar14 + 3;
                    uVar6 = (int)local_198 + 1;
                  } while (uVar6 != local_1b4);
                }
              }
              TreePop();
              pIVar13 = local_1c0;
              draw_list_00 = local_1a8;
              if ((float)local_1d8.ItemsCount != -NAN) {
                __assert_fail("ItemsCount == -1",
                              "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                              ,0x70e,"ImGuiListClipper::~ImGuiListClipper()");
              }
            }
          }
        }
        else {
          BulletText("Callback %p, user_data %p",pIVar2,*(undefined8 *)&draw_list_00->Flags);
        }
        pIVar13 = (ImDrawCmd *)(ulong)(uint)((int)pIVar13 + (draw_list_00->CmdBuffer).Size);
        draw_list_00 = (ImDrawList *)&draw_list_00->_Data;
      } while (draw_list_00 < (draw_list->CmdBuffer).Data + (draw_list->CmdBuffer).Size);
    }
  }
  TreePop();
  return;
}

Assistant:

static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f,0.4f,0.4f,1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            if (window && !window->WasActive)
                ImGui::TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

            unsigned int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }

                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                char buf[300];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd: %4d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                    pcmd->ElemCount/3, (void*)(intptr_t)pcmd->TextureId,
                    pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
                if (ImGui::IsItemHovered() && (show_drawcmd_mesh || show_drawcmd_aabb) && fg_draw_list)
                    NodeDrawCmdShowMeshAndBoundingBox(window, draw_list, pcmd, elem_offset, show_drawcmd_mesh, show_drawcmd_aabb);
                if (!pcmd_node_open)
                    continue;

                // Calculate approximate coverage area (touched pixel count)
                // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
                float total_area = 0.0f;
                for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + pcmd->ElemCount); base_idx += 3)
                {
                    ImVec2 triangle[3];
                    for (int n = 0; n < 3; n++)
                        triangle[n] = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
                }

                // Display vertex information summary. Hover to get all triangles drawn in wire-frame
                ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
                ImGui::Selectable(buf);
                if (ImGui::IsItemHovered() && fg_draw_list)
                    NodeDrawCmdShowMeshAndBoundingBox(window, draw_list, pcmd, elem_offset, true, false);

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangle[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                            triangle[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }

                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }